

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

void __thiscall
leveldb::VersionSet::VersionSet
          (VersionSet *this,string *dbname,Options *options,TableCache *table_cache,
          InternalKeyComparator *cmp)

{
  pointer pcVar1;
  long lVar2;
  Version *v;
  
  this->env_ = options->env;
  (this->dbname_)._M_dataplus._M_p = (pointer)&(this->dbname_).field_2;
  pcVar1 = (dbname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->dbname_,pcVar1,pcVar1 + dbname->_M_string_length);
  this->options_ = options;
  this->table_cache_ = table_cache;
  (this->icmp_).super_Comparator._vptr_Comparator = (_func_int **)&PTR__Comparator_0013a118;
  (this->icmp_).user_comparator_ = cmp->user_comparator_;
  this->next_file_number_ = 2;
  this->manifest_file_number_ = 0;
  this->last_sequence_ = 0;
  this->log_number_ = 0;
  this->prev_log_number_ = 0;
  this->descriptor_file_ = (WritableFile *)0x0;
  this->descriptor_log_ = (Writer *)0x0;
  (this->dummy_versions_).vset_ = this;
  (this->dummy_versions_).next_ = &this->dummy_versions_;
  (this->dummy_versions_).prev_ = &this->dummy_versions_;
  (this->dummy_versions_).refs_ = 0;
  memset((this->dummy_versions_).files_,0,0xb0);
  (this->dummy_versions_).file_to_compact_level_ = -1;
  (this->dummy_versions_).compaction_score_ = -1.0;
  (this->dummy_versions_).compaction_level_ = -1;
  this->current_ = (Version *)0x0;
  lVar2 = 0x180;
  do {
    *(long *)((long)this + lVar2 + -0x10) = (long)&this->env_ + lVar2;
    *(undefined8 *)((long)this + lVar2 + -8) = 0;
    *(undefined1 *)((long)&this->env_ + lVar2) = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x260);
  v = (Version *)operator_new(0xe8);
  v->vset_ = this;
  v->next_ = v;
  v->prev_ = v;
  v->refs_ = 0;
  memset(v->files_,0,0xb0);
  v->file_to_compact_level_ = -1;
  v->compaction_score_ = -1.0;
  v->compaction_level_ = -1;
  AppendVersion(this,v);
  return;
}

Assistant:

VersionSet::VersionSet(const std::string& dbname, const Options* options,
                       TableCache* table_cache,
                       const InternalKeyComparator* cmp)
    : env_(options->env),
      dbname_(dbname),
      options_(options),
      table_cache_(table_cache),
      icmp_(*cmp),
      next_file_number_(2),
      manifest_file_number_(0),  // Filled by Recover()
      last_sequence_(0),
      log_number_(0),
      prev_log_number_(0),
      descriptor_file_(nullptr),
      descriptor_log_(nullptr),
      dummy_versions_(this),
      current_(nullptr) {
  AppendVersion(new Version(this));
}